

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

int run_test_fs_event_watch_file_current_dir(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uv_loop_t *loop;
  uv_timer_t timer;
  
  loop_00 = uv_default_loop();
  remove("watch_file");
  create_file("watch_file");
  iVar1 = uv_fs_event_init(loop_00,&fs_event);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x2c0,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file_current_dir,"watch_file",0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x2c5,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_init(loop_00,(uv_timer_t *)&loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x2c9,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  loop = (uv_loop_t *)0x227ec2;
  iVar1 = uv_timer_start((uv_timer_t *)&loop,timer_cb_touch,0x44c,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x2cd,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)timer_cb_touch_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x2cf,"timer_cb_touch_called","==","0",(long)timer_cb_touch_called,"==",0);
    abort();
  }
  if ((long)fs_event_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x2d0,"fs_event_cb_called","==","0",(long)fs_event_cb_called,"==",0);
    abort();
  }
  if ((long)close_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x2d1,"close_cb_called","==","0",(long)close_cb_called,"==",0);
    abort();
  }
  uv_run(loop_00,UV_RUN_DEFAULT);
  if ((long)timer_cb_touch_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x2d5,"1","==","timer_cb_touch_called",1,"==",(long)timer_cb_touch_called);
    abort();
  }
  if (fs_event_cb_called == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x2d7,"0","!=","fs_event_cb_called",0,"!=",0);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x2d8,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  remove("watch_file");
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x2dd,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_event_watch_file_current_dir) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_timer_t timer;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  /* Setup */
  remove("watch_file");
  create_file("watch_file");
#if defined(__APPLE__) && !defined(MAC_OS_X_VERSION_10_12)
  /* Empirically, kevent seems to (sometimes) report the preceding
   * create_file events prior to macOS 10.11.6 in the subsequent fs_event_start
   * So let the system settle before running the test. */
  uv_sleep(1100);
  uv_update_time(loop);
#endif

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file_current_dir,
                        "watch_file",
                        0);
  ASSERT_OK(r);


  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  timer.data = "watch_file";
  r = uv_timer_start(&timer, timer_cb_touch, 1100, 0);
  ASSERT_OK(r);

  ASSERT_OK(timer_cb_touch_called);
  ASSERT_OK(fs_event_cb_called);
  ASSERT_OK(close_cb_called);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, timer_cb_touch_called);
  /* FSEvents on macOS sometimes sends one change event, sometimes two. */
  ASSERT_NE(0, fs_event_cb_called);
  ASSERT_EQ(1, close_cb_called);

  /* Cleanup */
  remove("watch_file");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}